

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_encoder.cc
# Opt level: O3

Status * __thiscall
draco::MeshEncoder::EncodeGeometryData(Status *__return_storage_ptr__,MeshEncoder *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  EncoderOptions *this_00;
  bool bVar3;
  Status *_local_status;
  string local_50;
  
  (*(this->super_PointCloudEncoder)._vptr_PointCloudEncoder[0x10])();
  if (__return_storage_ptr__->code_ == OK) {
    pcVar2 = (__return_storage_ptr__->error_msg_)._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->error_msg_).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
    this_00 = (this->super_PointCloudEncoder).options_;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"store_number_of_encoded_faces","");
    bVar3 = Options::GetBool((Options *)this_00,&local_50,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      (*(this->super_PointCloudEncoder)._vptr_PointCloudEncoder[0x11])(this);
    }
    __return_storage_ptr__->code_ = OK;
    (__return_storage_ptr__->error_msg_)._M_dataplus._M_p = (pointer)paVar1;
    (__return_storage_ptr__->error_msg_)._M_string_length = 0;
    (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

Status MeshEncoder::EncodeGeometryData() {
  DRACO_RETURN_IF_ERROR(EncodeConnectivity());
  if (options()->GetGlobalBool("store_number_of_encoded_faces", false)) {
    ComputeNumberOfEncodedFaces();
  }
  return OkStatus();
}